

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Collision *collision)

{
  ostream *poVar1;
  ostream *in_RSI;
  ostream *in_RDI;
  Vector3 *in_stack_ffffffffffffffe8;
  
  poVar1 = std::operator<<(in_RDI,"crash: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)((byte)in_RSI[0x18] & 1));
  std::operator<<(poVar1," O: ");
  poVar1 = operator<<(in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(poVar1," N: ");
  poVar1 = operator<<(in_RSI,in_stack_ffffffffffffffe8);
  poVar1 = std::operator<<(poVar1," dist: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x50));
  poVar1 = std::operator<<(poVar1," primitive: ");
  std::ostream::operator<<(poVar1,*(void **)(in_RSI + 0x58));
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Collision &collision) {
    os << "crash: " << collision.crash << " O: " << collision.P << " N: " << collision.N << " dist: " << collision.dist
       << " primitive: " << collision.primitive;
    return os;
}